

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,Graph *g)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  ulong uVar9;
  
  ppVar1 = (g->super_ProcessorBase).endpoints.
           super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((g->super_ProcessorBase).endpoints.
      super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    uVar9 = 0;
    do {
      (*this->_vptr_ASTVisitor[5])(this,ppVar1[uVar9].object);
      uVar9 = uVar9 + 1;
      ppVar1 = (g->super_ProcessorBase).endpoints.
               super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(g->super_ProcessorBase).endpoints.
                                   super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3));
  }
  ppVar2 = (g->super_ProcessorBase).super_ModuleBase.usings.
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((g->super_ProcessorBase).super_ModuleBase.usings.
      super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    uVar9 = 0;
    do {
      (*this->_vptr_ASTVisitor[3])(this,ppVar2[uVar9].object);
      uVar9 = uVar9 + 1;
      ppVar2 = (g->super_ProcessorBase).super_ModuleBase.usings.
               super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(g->super_ProcessorBase).super_ModuleBase.usings.
                                   super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3));
  }
  ppVar3 = (g->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((g->processorInstances).
      super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
    uVar9 = 0;
    do {
      (*this->_vptr_ASTVisitor[5])(this,ppVar3[uVar9].object);
      uVar9 = uVar9 + 1;
      ppVar3 = (g->processorInstances).
               super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(g->processorInstances).
                                   super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 3));
  }
  ppVar4 = (g->processorAliases).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((g->processorAliases).
      super__Vector_base<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
    uVar9 = 0;
    do {
      (*this->_vptr_ASTVisitor[5])(this,ppVar4[uVar9].object);
      uVar9 = uVar9 + 1;
      ppVar4 = (g->processorAliases).
               super__Vector_base<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(g->processorAliases).
                                   super__Vector_base<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 3));
  }
  ppVar5 = (g->connections).
           super__Vector_base<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((g->connections).
      super__Vector_base<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
    uVar9 = 0;
    do {
      (*this->_vptr_ASTVisitor[5])(this,ppVar5[uVar9].object);
      uVar9 = uVar9 + 1;
      ppVar5 = (g->connections).
               super__Vector_base<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(g->connections).
                                   super__Vector_base<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 3));
  }
  ppVar6 = (g->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((g->constants).
      super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar6) {
    uVar9 = 0;
    do {
      (*this->_vptr_ASTVisitor[4])(this,ppVar6[uVar9].object);
      uVar9 = uVar9 + 1;
      ppVar6 = (g->constants).
               super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(g->constants).
                                   super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 >> 3));
  }
  ppVar7 = (g->super_ProcessorBase).super_ModuleBase.namespaceAliases.
           super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((g->super_ProcessorBase).super_ModuleBase.namespaceAliases.
      super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar7) {
    uVar9 = 0;
    do {
      (*this->_vptr_ASTVisitor[5])(this,ppVar7[uVar9].object);
      uVar9 = uVar9 + 1;
      ppVar7 = (g->super_ProcessorBase).super_ModuleBase.namespaceAliases.
               super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(g->super_ProcessorBase).super_ModuleBase.namespaceAliases.
                                   super__Vector_base<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar7 >> 3));
  }
  ppVar8 = (g->super_ProcessorBase).super_ModuleBase.staticAssertions.
           super__Vector_base<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((g->super_ProcessorBase).super_ModuleBase.staticAssertions.
      super__Vector_base<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar8) {
    uVar9 = 0;
    do {
      (*this->_vptr_ASTVisitor[3])(this,ppVar8[uVar9].object);
      uVar9 = uVar9 + 1;
      ppVar8 = (g->super_ProcessorBase).super_ModuleBase.staticAssertions.
               super__Vector_base<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(g->super_ProcessorBase).super_ModuleBase.staticAssertions.
                                   super__Vector_base<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar8 >> 3));
  }
  return;
}

Assistant:

virtual void visit (AST::Graph& g)
    {
        visitArray (g.endpoints);
        visitArray (g.usings);
        visitArray (g.processorInstances);
        visitArray (g.processorAliases);
        visitArray (g.connections);
        visitArray (g.constants);
        visitArray (g.namespaceAliases);
        visitArray (g.staticAssertions);
    }